

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GPUShaderFP64Test7::getTessellationControlShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  _variable_type type;
  pointer p_Var2;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  _variable_type type_00;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  string variable_type_string;
  stringstream array_index_sstream;
  stringstream result_sstream;
  string local_3c0;
  uint local_39c;
  long *local_398;
  long local_390;
  long local_388 [2];
  long *local_378;
  long local_370;
  long local_368 [2];
  string *local_358;
  ulong local_350;
  _variables *local_348;
  undefined1 local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar8 = "#version 400\n\nlayout (vertices=4) out;\nin VS_DATA\n{\n";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#version 400\n\nlayout (vertices=4) out;\nin VS_DATA\n{\n",0x34);
  getVariableDeclarations_abi_cxx11_
            ((string *)local_340,(GPUShaderFP64Test7 *)pcVar8,"vs",variables,
             ::glcts::fixed_sample_locations_values + 1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  pcVar8 = "} in_data[];\nout TC_DATA\n{\n";
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} in_data[];\nout TC_DATA\n{\n",0x1b);
  getVariableDeclarations_abi_cxx11_
            (&local_3c0,(GPUShaderFP64Test7 *)pcVar8,"tc",variables,
             ::glcts::fixed_sample_locations_values + 1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "} out_data[];\n\nvoid main()\n{\n    gl_TessLevelInner[0] = 1;\n    gl_TessLevelInner[1] = 1;\n    gl_TessLevelOuter[0] = 1;\n    gl_TessLevelOuter[1] = 1;\n    gl_TessLevelOuter[2] = 1;\n    gl_TessLevelOuter[3] = 1;\n\n"
             ,0xd2);
  local_358 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  lVar5 = (long)(variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_348 = variables;
  if (lVar5 != 0) {
    local_350 = (lVar5 >> 2) * -0x5555555555555555;
    uVar6 = 0;
    do {
      p_Var2 = (local_348->
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar1 = p_Var2[uVar6].array_size;
      type = p_Var2[uVar6].type;
      local_39c = Utils::getNumberOfComponentsForVariableType(type);
      Utils::getVariableTypeString_abi_cxx11_(&local_3c0,(Utils *)(ulong)type,type_00);
      if ((ulong)uVar1 != 0) {
        uVar7 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)local_340);
          if (uVar1 != 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),"[",1);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)(local_340 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"out_data[gl_InvocationID].tc_variable",0x25);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(char *)local_378,local_370);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," = in_data[0].vs_variable",0x19);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__cxx11::stringbuf::str();
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(char *)local_398,local_390);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," + ",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
          if (local_398 != local_388) {
            operator_delete(local_398,local_388[0] + 1);
          }
          uVar9 = local_39c;
          if (local_378 != local_368) {
            operator_delete(local_378,local_368[0] + 1);
            uVar9 = local_39c;
          }
          do {
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            if (uVar9 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            }
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
          std::ios_base::~ios_base(local_2c0);
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < local_350);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  psVar3 = local_358;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

std::string GPUShaderFP64Test7::getTessellationControlShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "layout (vertices=4) out;\n"

					  /* Declare input block */
					  "in VS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("vs", variables) << "} in_data[];\n"

																  /* Declare output block */
																  "out TC_DATA\n"
																  "{\n"
				   << getVariableDeclarations("tc", variables) << "} out_data[];\n"
																  "\n"

																  /* Define main() */
																  "void main()\n"
																  "{\n"
																  "    gl_TessLevelInner[0] = 1;\n"
																  "    gl_TessLevelInner[1] = 1;\n"
																  "    gl_TessLevelOuter[0] = 1;\n"
																  "    gl_TessLevelOuter[1] = 1;\n"
																  "    gl_TessLevelOuter[2] = 1;\n"
																  "    gl_TessLevelOuter[3] = 1;\n"
																  "\n";

	/* Take input variables, add a predefined value and forward them to output variables */
	const size_t n_variables = variables.size();
	unsigned int counter	 = 2;

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			result_sstream << "out_data[gl_InvocationID].tc_variable" << n_variable << array_index_sstream.str()
						   << " = in_data[0].vs_variable" << n_variable << array_index_sstream.str() << " + "
						   << variable_type_string << "(";

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << (counter++);

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			}

			result_sstream << ");\n";
		} /* for (all array indices) */
	}	 /* for (all variable types) */

	result_sstream << "}\n";

	/* We're done */
	return result_sstream.str();
}